

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CellTypeBuilder.cpp
# Opt level: O0

shared_ptr<CellType> __thiscall CellTypeBuilder::getProduct(CellTypeBuilder *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CellTypeBuilder *in_RSI;
  shared_ptr<CellType> sVar1;
  CellTypeBuilder *this_local;
  shared_ptr<CellType> *oldPtr;
  
  std::shared_ptr<CellType>::shared_ptr((shared_ptr<CellType> *)this,&in_RSI->cellPtr);
  reset(in_RSI);
  sVar1.super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<CellType>)sVar1.super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CellType> CellTypeBuilder::getProduct() {
  std::shared_ptr<CellType> oldPtr = std::move(cellPtr);
  reset();
  return oldPtr;
}